

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
check_populate_pixelAspectRatio
          (exr_context_t ctxt,exr_priv_part_t curpart,_internal_exr_seq_scratch *scratch,char *tname
          ,int32_t attrsz)

{
  int iVar1;
  exr_result_t eVar2;
  char *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int32_t unaff_retaddr;
  exr_attribute_type_t unaff_retaddr_00;
  char *in_stack_00000008;
  exr_attribute_list_t *in_stack_00000010;
  anon_union_4_2_317b9c1e tpun;
  exr_result_t rv;
  uint32_t local_34;
  int local_30;
  int local_2c;
  char *local_28;
  long local_20;
  long local_18;
  long local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = strcmp(in_RCX,"float");
  if (iVar1 == 0) {
    if (local_2c == 4) {
      local_30 = (**(code **)(local_20 + 0x20))(local_20,&local_34,4);
      if (local_30 == 0) {
        local_34 = one_to_native32(0);
        if (*(long *)(local_18 + 0x48) == 0) {
          local_30 = exr_attr_list_add_static_name
                               ((exr_context_t)CONCAT44(attrsz,rv),in_stack_00000010,
                                in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                                (uint8_t **)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                (exr_attribute_t **)curpart);
          if (local_30 == 0) {
            *(uint32_t *)(*(long *)(local_18 + 0x48) + 0x18) = local_34;
            eVar2 = 0;
          }
          else {
            eVar2 = (**(code **)(local_10 + 0x48))
                              (local_10,local_30,
                               "Unable to initialize attribute \'%s\', type \'float\'",
                               "pixelAspectRatio");
          }
        }
        else if (*(char *)(local_10 + 6) == '\0') {
          *(uint32_t *)(*(long *)(local_18 + 0x48) + 0x18) = local_34;
          eVar2 = 0;
        }
        else {
          eVar2 = (**(code **)(local_10 + 0x48))
                            (local_10,0xe,"Duplicate copy of required attribute \'%s\' encountered",
                             "pixelAspectRatio");
        }
      }
      else {
        eVar2 = (**(code **)(local_10 + 0x48))
                          (local_10,local_30,"Attribute \'%s\': Unable to read data (%d bytes)",
                           "pixelAspectRatio",local_2c);
      }
    }
    else {
      (**(code **)(local_20 + 0x28))(local_20,local_2c);
      eVar2 = (**(code **)(local_10 + 0x48))
                        (local_10,0x11,"Required attribute \'%s\': Invalid size %d (exp 4)",
                         "pixelAspectRatio",local_2c);
    }
  }
  else {
    (**(code **)(local_20 + 0x28))(local_20,local_2c);
    eVar2 = (**(code **)(local_10 + 0x48))
                      (local_10,0x10,"Required attribute \'%s\': Invalid type \'%s\'",
                       "pixelAspectRatio",local_28);
  }
  return eVar2;
}

Assistant:

static exr_result_t
check_populate_pixelAspectRatio (
    exr_context_t                     ctxt,
    exr_priv_part_t                   curpart,
    struct _internal_exr_seq_scratch* scratch,
    const char*                       tname,
    int32_t                           attrsz)
{
    exr_result_t rv;
    union
    {
        uint32_t ival;
        float    fval;
    } tpun;

    if (0 != strcmp (tname, "float"))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "Required attribute '%s': Invalid type '%s'",
            EXR_REQ_PAR_STR,
            tname);
    }

    if (attrsz != sizeof (float))
    {
        scratch->sequential_skip (scratch, attrsz);
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Required attribute '%s': Invalid size %d (exp 4)",
            EXR_REQ_PAR_STR,
            attrsz);
    }

    rv = scratch->sequential_read (scratch, &(tpun.ival), sizeof (uint32_t));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Attribute '%s': Unable to read data (%d bytes)",
            EXR_REQ_PAR_STR,
            attrsz);

    tpun.ival = one_to_native32 (tpun.ival);

    if (curpart->pixelAspectRatio)
    {
        if (ctxt->strict_header)
        {
            return ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Duplicate copy of required attribute '%s' encountered",
                EXR_REQ_PAR_STR);
        }

        /* legacy code allowed attributes to just overwrite, preserve
         * that behavior (barring other failure)
         */
        curpart->pixelAspectRatio->f = tpun.fval;
        return EXR_ERR_SUCCESS;
    }

    rv = exr_attr_list_add_static_name (
        ctxt,
        &(curpart->attributes),
        EXR_REQ_PAR_STR,
        EXR_ATTR_FLOAT,
        0,
        NULL,
        &(curpart->pixelAspectRatio));
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Unable to initialize attribute '%s', type 'float'",
            EXR_REQ_PAR_STR);

    curpart->pixelAspectRatio->f = tpun.fval;
    return rv;
}